

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_handle.cpp
# Opt level: O3

void __thiscall duckdb::BlockHandle::ChangeMemoryUsage(BlockHandle *this,BlockLock *l,int64_t delta)

{
  __int_type _Var1;
  
  LOCK();
  (this->memory_usage).super___atomic_base<unsigned_long>._M_i =
       (this->memory_usage).super___atomic_base<unsigned_long>._M_i + delta;
  UNLOCK();
  _Var1 = (this->memory_usage).super___atomic_base<unsigned_long>._M_i;
  BufferPool::MemoryUsage::UpdateUsedMemory
            (&((this->memory_charge).pool)->memory_usage,(this->memory_charge).tag,
             _Var1 - (this->memory_charge).size);
  (this->memory_charge).size = _Var1;
  return;
}

Assistant:

void BlockHandle::ChangeMemoryUsage(BlockLock &l, int64_t delta) {
	VerifyMutex(l);

	D_ASSERT(delta < 0);
	memory_usage += static_cast<idx_t>(delta);
	memory_charge.Resize(memory_usage);
}